

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,
          ReadableDirectory *dir,PathPtr path)

{
  long *plVar1;
  uchar *local_60;
  size_t local_58;
  ArrayDisposer *local_50;
  undefined8 *local_48;
  long *local_40;
  
  (*(dir->super_FsNode)._vptr_FsNode[10])(&local_48,dir,path.parts.ptr,path.parts.size_);
  plVar1 = local_40;
  if (local_40 == (long *)0x0) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (**(code **)(*local_40 + 0x10))(&local_48,local_40);
    (**(code **)(*plVar1 + 0x38))(&local_60,plVar1,0,local_40);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = local_60;
    (__return_storage_ptr__->ptr).field_1.value.size_ = local_58;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_50;
    (**(code **)*local_48)(local_48,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbed(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    return file->mmap(0, file->stat().size);
  }
  return kj::none;
}